

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AppendProperty(cmMakefile *this,string *prop,char *value,bool asString)

{
  int iVar1;
  pointer dir;
  cmListFileBacktrace lfbt;
  allocator local_c9;
  string local_c8;
  cmListFileBacktrace local_a8;
  cmValueWithOrigin local_70;
  
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    GetBacktrace(&local_a8,this);
    std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
    cmValueWithOrigin::cmValueWithOrigin(&local_70,&local_c8,&local_a8);
    std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
    emplace_back<cmValueWithOrigin>(&this->IncludeDirectoriesEntries,&local_70);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)prop);
    if (iVar1 == 0) {
      GetBacktrace(&local_a8,this);
      std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
      cmValueWithOrigin::cmValueWithOrigin(&local_70,&local_c8,&local_a8);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
      emplace_back<cmValueWithOrigin>(&this->CompileOptionsEntries,&local_70);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)prop);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)prop);
        if (iVar1 == 0) {
          local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&local_70,value,(allocator *)&local_c8);
          cmSystemTools::ExpandListArgument
                    (&local_70.Value,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_a8,false);
          dir = local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
                super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
                super__Vector_impl_data._M_start;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
            operator_delete(local_70.Value._M_dataplus._M_p,
                            local_70.Value.field_2._M_allocated_capacity + 1);
            dir = local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
                  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
                  super__Vector_impl_data._M_start;
          }
          for (; dir != local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>
                        .super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>.
                        _M_impl.super__Vector_impl_data._M_finish; dir = (pointer)&dir->FilePath) {
            AddLinkDirectory(this,&dir->Name);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8);
          return;
        }
        cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
        return;
      }
      GetBacktrace(&local_a8,this);
      std::__cxx11::string::string((string *)&local_c8,value,&local_c9);
      cmValueWithOrigin::cmValueWithOrigin(&local_70,&local_c8,&local_a8);
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::
      emplace_back<cmValueWithOrigin>(&this->CompileDefinitionsEntries,&local_70);
    }
  }
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_70.Backtrace.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
    operator_delete(local_70.Value._M_dataplus._M_p,local_70.Value.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_a8.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmMakefile::AppendProperty(const std::string& prop,
                                const char* value,
                                bool asString)
{
  if (prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->IncludeDirectoriesEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileOptionsEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->GetBacktrace();
    this->CompileDefinitionsEntries.push_back(
                                        cmValueWithOrigin(value, lfbt));
    return;
    }
  if ( prop == "LINK_DIRECTORIES" )
    {
    std::vector<std::string> varArgsExpanded;
    cmSystemTools::ExpandListArgument(value, varArgsExpanded);
    for(std::vector<std::string>::const_iterator vi = varArgsExpanded.begin();
        vi != varArgsExpanded.end(); ++vi)
      {
      this->AddLinkDirectory(*vi);
      }
    return;
    }

  this->Properties.AppendProperty(prop, value, asString);
}